

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O2

string * __thiscall
VulkanHppGenerator::generateSharedHandlesNoDestroy_abi_cxx11_
          (string *__return_storage_ptr__,VulkanHppGenerator *this)

{
  pointer pFVar1;
  pointer pEVar2;
  FeatureData *feature;
  pointer title;
  pointer pEVar3;
  string sStack_48;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  pFVar1 = (this->m_features).
           super__Vector_base<VulkanHppGenerator::FeatureData,_std::allocator<VulkanHppGenerator::FeatureData>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (title = (this->m_features).
               super__Vector_base<VulkanHppGenerator::FeatureData,_std::allocator<VulkanHppGenerator::FeatureData>_>
               ._M_impl.super__Vector_impl_data._M_start; title != pFVar1; title = title + 1) {
    generateSharedHandleNoDestroy(&sStack_48,this,&title->requireData,&title->name);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (__return_storage_ptr__,&sStack_48);
    std::__cxx11::string::~string((string *)&sStack_48);
  }
  pEVar2 = (this->m_extensions).
           super__Vector_base<VulkanHppGenerator::ExtensionData,_std::allocator<VulkanHppGenerator::ExtensionData>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pEVar3 = (this->m_extensions).
                super__Vector_base<VulkanHppGenerator::ExtensionData,_std::allocator<VulkanHppGenerator::ExtensionData>_>
                ._M_impl.super__Vector_impl_data._M_start; pEVar3 != pEVar2; pEVar3 = pEVar3 + 1) {
    generateSharedHandleNoDestroy(&sStack_48,this,&pEVar3->requireData,&pEVar3->name);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (__return_storage_ptr__,&sStack_48);
    std::__cxx11::string::~string((string *)&sStack_48);
  }
  if ((__return_storage_ptr__->_M_dataplus)._M_p[__return_storage_ptr__->_M_string_length - 1] ==
      '\n') {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
              (__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  __assert_fail("sharedHandles.back() == \'\\n\'",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                ,0x3216,"std::string VulkanHppGenerator::generateSharedHandlesNoDestroy() const");
}

Assistant:

std::string VulkanHppGenerator::generateSharedHandlesNoDestroy() const
{
  std::string sharedHandles;
  for ( auto const & feature : m_features )
  {
    sharedHandles += generateSharedHandleNoDestroy( feature.requireData, feature.name );
  }
  for ( auto const & extension : m_extensions )
  {
    sharedHandles += generateSharedHandleNoDestroy( extension.requireData, extension.name );
  }
  assert( sharedHandles.back() == '\n' );
  sharedHandles.pop_back();
  return sharedHandles;
}